

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  Message *prototype;
  Message *pMVar1;
  Message *extraout_RDX;
  Message *extraout_RDX_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  pMVar1 = (Message *)other_elems;
  if (already_allocated < length) {
    arena = this->arena_;
    prototype = (Message *)*other_elems;
    for (lVar3 = (long)already_allocated; lVar3 < length; lVar3 = lVar3 + 1) {
      pMVar1 = GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(prototype,arena);
      our_elems[lVar3] = pMVar1;
      pMVar1 = extraout_RDX;
    }
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    GenericTypeHandler<google::protobuf::Message>::Merge
              ((GenericTypeHandler<google::protobuf::Message> *)other_elems[uVar4],
               (Message *)our_elems[uVar4],pMVar1);
    pMVar1 = extraout_RDX_00;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  if (already_allocated < length) {
    Arena* arena = GetArena();
    typename TypeHandler::Type* elem_prototype =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[0]);
    for (int i = already_allocated; i < length; i++) {
      // Allocate a new empty element that we'll merge into below
      typename TypeHandler::Type* new_elem =
          TypeHandler::NewFromPrototype(elem_prototype, arena);
      our_elems[i] = new_elem;
    }
  }
  // Main loop that does the actual merging
  for (int i = 0; i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
}